

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

int main(void)

{
  int iVar1;
  GLFWwindow *handle;
  long lVar2;
  undefined8 *arg;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int result;
  Thread threads [3];
  int local_9c;
  undefined8 local_98 [4];
  thrd_t local_78 [12];
  
  arg = local_98;
  puVar3 = &DAT_00114cc0;
  puVar4 = arg;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + 1;
    puVar4 = puVar4 + 1;
  }
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    glfwWindowHint(0x20004,0);
    lVar2 = -0x2ee;
    while( true ) {
      handle = glfwCreateWindow(200,200,(char *)arg[1],(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      *arg = handle;
      if (handle == (GLFWwindow *)0x0) break;
      glfwSetWindowPos(handle,(int)lVar2 + 0x3b6,200);
      glfwShowWindow((GLFWwindow *)*arg);
      iVar1 = thrd_create(arg + 4,thread_main,arg);
      if (iVar1 != 1) {
        fwrite("Failed to create secondary thread\n",0x22,1,_stderr);
        break;
      }
      arg = arg + 5;
      lVar2 = lVar2 + 0xfa;
      if (lVar2 == 0) {
        while (running != '\0') {
          glfwWaitEvents();
          lVar2 = 0;
          do {
            iVar1 = glfwWindowShouldClose(*(GLFWwindow **)((long)local_98 + lVar2));
            if (iVar1 != 0) {
              running = '\0';
            }
            lVar2 = lVar2 + 0x28;
          } while (lVar2 != 0x78);
        }
        lVar2 = 0;
        do {
          thrd_join(*(thrd_t *)((long)local_78 + lVar2),&local_9c);
          lVar2 = lVar2 + 0x28;
        } while (lVar2 != 0x78);
        exit(0);
      }
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int i, result;
    Thread threads[] =
    {
        { NULL, "Red", 1.f, 0.f, 0.f, 0 },
        { NULL, "Green", 0.f, 1.f, 0.f, 0 },
        { NULL, "Blue", 0.f, 0.f, 1.f, 0 }
    };
    const int count = sizeof(threads) / sizeof(Thread);

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    for (i = 0;  i < count;  i++)
    {
        threads[i].window = glfwCreateWindow(200, 200,
                                             threads[i].title,
                                             NULL, NULL);
        if (!threads[i].window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetWindowPos(threads[i].window, 200 + 250 * i, 200);
        glfwShowWindow(threads[i].window);

        if (thrd_create(&threads[i].id, thread_main, threads + i) !=
            thrd_success)
        {
            fprintf(stderr, "Failed to create secondary thread\n");

            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    while (running)
    {
        glfwWaitEvents();

        for (i = 0;  i < count;  i++)
        {
            if (glfwWindowShouldClose(threads[i].window))
                running = GL_FALSE;
        }
    }

    for (i = 0;  i < count;  i++)
        thrd_join(threads[i].id, &result);

    exit(EXIT_SUCCESS);
}